

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

Error __thiscall asmjit::_abi_1_10::JitAllocator::release(JitAllocator *this,void *rxPtr)

{
  uint uVar1;
  Impl *pIVar2;
  JitAllocatorPool *pJVar3;
  JitAllocatorBlock *this_00;
  size_t sVar4;
  JitAllocatorBlock *pJVar5;
  bool value;
  Error EVar6;
  uint32_t releasedAreaStart;
  ulong uVar7;
  void *mem;
  uint32_t releasedAreaEnd;
  pthread_mutex_t *__mutex;
  Compare<(asmjit::_abi_1_10::Support::SortOrder)0> local_51;
  pthread_mutex_t *local_50;
  uint32_t *local_48;
  ProtectJitReadWriteScope scope;
  
  pIVar2 = this->_impl;
  if (pIVar2 == (Impl *)JitAllocatorImpl_none) {
    EVar6 = 5;
  }
  else if (rxPtr == (void *)0x0) {
    EVar6 = 2;
  }
  else {
    __mutex = (pthread_mutex_t *)(pIVar2 + 1);
    pthread_mutex_lock(__mutex);
    scope._rxPtr = rxPtr;
    this_00 = ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock>::
              get<unsigned_char*,asmjit::_abi_1_10::Support::Compare<(asmjit::_abi_1_10::Support::SortOrder)0>>
                        ((ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock> *)&pIVar2[4].granularity,
                         (uchar **)&scope,&local_51);
    if (this_00 == (JitAllocatorBlock *)0x0) {
      EVar6 = 3;
    }
    else {
      pJVar3 = this_00->_pool;
      uVar7 = (ulong)((long)rxPtr - (long)(this_00->_mapping).rx) >>
              (pJVar3->granularityLog2 & 0x3f);
      releasedAreaStart = (uint32_t)uVar7;
      local_50 = __mutex;
      local_48 = &pIVar2[4].granularity;
      sVar4 = Support::bitVectorIndexOf<unsigned_long>
                        (this_00->_stopBitVector,uVar7 & 0xffffffff,value);
      releasedAreaEnd = (int)sVar4 + 1;
      *(long *)(pIVar2 + 4) = *(long *)(pIVar2 + 4) + -1;
      JitAllocatorBlock::markReleasedArea(this_00,releasedAreaStart,releasedAreaEnd);
      if ((pIVar2->options & kFillUnusedMemory) != kNone) {
        mem = (void *)((ulong)(releasedAreaStart * pJVar3->granularity) +
                      (long)(this_00->_mapping).rw);
        uVar7 = (ulong)((releasedAreaEnd - releasedAreaStart) * (uint)pJVar3->granularity);
        scope._rxPtr = mem;
        scope._size = uVar7;
        VirtMem::protectJitMemory(kReadWrite);
        JitAllocatorImpl_fillPattern(mem,pIVar2->fillPattern,uVar7);
        VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope(&scope);
      }
      __mutex = local_50;
      EVar6 = 0;
      if (this_00->_areaUsed == 0) {
        if ((pJVar3->emptyBlockCount == '\0') && ((pIVar2->options & kImmediateRelease) == kNone)) {
          pJVar3->emptyBlockCount = '\x01';
        }
        else {
          pJVar3 = this_00->_pool;
          if (pJVar3->cursor == this_00) {
            pJVar5 = (this_00->super_ZoneListNode<asmjit::_abi_1_10::JitAllocatorBlock>)._listNodes
                     [0];
            if (pJVar5 == (JitAllocatorBlock *)0x0) {
              pJVar5 = (this_00->super_ZoneListNode<asmjit::_abi_1_10::JitAllocatorBlock>).
                       _listNodes[1];
            }
            pJVar3->cursor = pJVar5;
          }
          ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock>::
          remove<asmjit::_abi_1_10::Support::Compare<(asmjit::_abi_1_10::Support::SortOrder)0>>
                    ((ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock> *)local_48,
                     (ZoneTreeNode *)this_00,
                     (Compare<(asmjit::_abi_1_10::Support::SortOrder)0> *)&scope);
          pJVar5 = this_00;
          ZoneList<asmjit::_abi_1_10::JitAllocatorBlock>::unlink(&pJVar3->blocks,(char *)this_00);
          pJVar3->blockCount = pJVar3->blockCount - 1;
          uVar1 = this_00->_areaSize;
          pJVar3->totalAreaSize = pJVar3->totalAreaSize - (ulong)uVar1;
          pJVar3->totalOverheadBytes =
               pJVar3->totalOverheadBytes - (ulong)((uVar1 + 0x3f >> 2 & 0xfffffff0) + 0x68);
          JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)this_00,pJVar5);
        }
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return EVar6;
}

Assistant:

Error JitAllocator::release(void* rxPtr) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!rxPtr))
    return DebugUtils::errored(kErrorInvalidArgument);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  LockGuard guard(impl->lock);

  JitAllocatorBlock* block = impl->tree.get(static_cast<uint8_t*>(rxPtr));
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidState);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)rxPtr - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaIndex = uint32_t(offset >> pool->granularityLog2);
  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaIndex, true)) + 1;
  uint32_t areaSize = areaEnd - areaIndex;

  impl->allocationCount--;
  block->markReleasedArea(areaIndex, areaEnd);

  // Fill the released memory if the secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + areaIndex * pool->granularity;
    size_t spanSize = areaSize * pool->granularity;

    VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize);
    JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
  }

  // Release the whole block if it became empty.
  if (block->areaUsed() == 0) {
    if (pool->emptyBlockCount || Support::test(impl->options, JitAllocatorOptions::kImmediateRelease)) {
      JitAllocatorImpl_removeBlock(impl, block);
      JitAllocatorImpl_deleteBlock(impl, block);
    }
    else {
      pool->emptyBlockCount++;
    }
  }

  return kErrorOk;
}